

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O3

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
BlindMerge(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *this,array<std::vector<int,_std::allocator<int>_>_*,_2UL> *arrs,ValueVector *write,
          iterator cur_run,size_t arr_index)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  vector<int,_std::allocator<int>_> *pvVar6;
  _List_node_base *p_Var7;
  vector<int,_std::allocator<int>_> *pvVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  int iVar12;
  long lVar13;
  _List_node_base *p_Var14;
  long lVar15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  _List_node_base *p_Var18;
  
  p_Var3 = cur_run._M_node[1]._M_prev;
  p_Var4 = (cur_run._M_node)->_M_next;
  p_Var5 = p_Var4[1]._M_prev;
  pvVar6 = arrs->_M_elems[(long)p_Var4[1]._M_next];
  p_Var7 = cur_run._M_node[2]._M_next;
  p_Var4 = p_Var4[2]._M_next;
  p_Var14 = p_Var3;
  p_Var16 = p_Var5;
  if (p_Var7 == (_List_node_base *)0x0) {
LAB_001063e0:
    if ((_List_node_base *)((long)p_Var16 - (long)p_Var5) < p_Var4) {
      piVar9 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (write->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = 0;
      do {
        piVar10[(long)((long)&p_Var14->_M_next + lVar15)] = piVar9[(long)&p_Var16->_M_next + lVar15]
        ;
        lVar13 = lVar15 + 1;
        lVar15 = lVar15 + 1;
      } while ((_List_node_base *)
               ((long)&((_List_node_base *)((long)p_Var16 - (long)p_Var5))->_M_next + lVar13) <
               p_Var4);
    }
  }
  else {
    pvVar8 = arrs->_M_elems[(long)cur_run._M_node[1]._M_next];
    if (p_Var4 == (_List_node_base *)0x0) {
      p_Var18 = (_List_node_base *)0x0;
    }
    else {
      piVar9 = (write->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar11 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      p_Var17 = p_Var3;
      do {
        iVar1 = piVar10[(long)p_Var17];
        iVar2 = piVar11[(long)p_Var16];
        iVar12 = iVar2;
        if (iVar1 < iVar2) {
          iVar12 = iVar1;
        }
        p_Var16 = (_List_node_base *)((long)&p_Var16->_M_next + (ulong)(iVar2 <= iVar1));
        p_Var17 = (_List_node_base *)((long)&p_Var17->_M_next + (ulong)(iVar1 < iVar2));
        piVar9[(long)p_Var14] = iVar12;
        p_Var14 = (_List_node_base *)((long)&p_Var14->_M_next + 1);
        p_Var18 = (_List_node_base *)((long)p_Var17 - (long)p_Var3);
        if (p_Var7 <= p_Var18) goto LAB_001063e0;
      } while ((_List_node_base *)((long)p_Var16 - (long)p_Var5) < p_Var4);
    }
    piVar9 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar10 = (write->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start;
    lVar15 = 0;
    do {
      piVar10[(long)((long)&p_Var14->_M_next + lVar15)] =
           piVar9[(long)&p_Var18->_M_next + (long)&p_Var3->_M_next + lVar15];
      lVar15 = lVar15 + 1;
    } while ((long)p_Var7 - (long)p_Var18 != lVar15);
  }
  cur_run._M_node[1]._M_next = (_List_node_base *)arr_index;
  return;
}

Assistant:

void BlindMerge(std::array<ValueVector *, 2> &arrs, ValueVector &write,
                    typename std::list<RunInfo>::iterator cur_run, size_t arr_index) {
        auto next_run = std::next(cur_run, 1);
        size_t one = cur_run->elem_index,
                two = next_run->elem_index,
                k = cur_run->elem_index;
        ValueVector &curr_arr = *arrs[cur_run->array_index];
        ValueVector &next_arr = *arrs[next_run->array_index];

        while ((one - cur_run->elem_index) < cur_run->run_size &&
               (two - next_run->elem_index) < next_run->run_size) {

            if (curr_arr[one] < next_arr[two]) {
                write[k] = curr_arr[one];
                one++;
            } else {
                write[k] = next_arr[two];
                two++;
            }
            k++;
        }
        // if both runs don't have the same size, copy the remaining elements over
        if ((one - cur_run->elem_index) < cur_run->run_size) {
            for (size_t i = (one - cur_run->elem_index); i < cur_run->run_size; i++) {
                write[k] = curr_arr[i + cur_run->elem_index];
                k++;
            }
        } else {
            for (size_t i = (two - next_run->elem_index); i < next_run->run_size; i++) {
                write[k] = next_arr[i + next_run->elem_index];
                k++;
            }
        }
        cur_run->array_index = arr_index;
    }